

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_extensions.cpp
# Opt level: O3

spv_result_t
spvtools::val::anon_unknown_0::ValidateKernelDecl(ValidationState_t *_,Instruction *inst)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  NonSemanticClspvReflectionInstructions NVar4;
  Instruction *this;
  long lVar5;
  char *pcVar6;
  DiagnosticStream DStack_1f8;
  
  uVar2 = Instruction::GetOperandAs<unsigned_int>(inst,4);
  this = ValidationState_t::FindDef(_,uVar2);
  if ((this != (Instruction *)0x0) &&
     (bVar1 = spvIsExtendedInstruction((uint)(this->inst_).opcode), bVar1)) {
    uVar2 = Instruction::GetOperandAs<unsigned_int>(this,2);
    uVar3 = Instruction::GetOperandAs<unsigned_int>(inst,2);
    if (uVar2 != uVar3) {
      ValidationState_t::diag(&DStack_1f8,_,SPV_ERROR_INVALID_ID,inst);
      pcVar6 = "Kernel must be from the same extended instruction import";
      lVar5 = 0x38;
      goto LAB_002ddbaf;
    }
    NVar4 = Instruction::GetOperandAs<NonSemanticClspvReflectionInstructions>(this,3);
    if (NVar4 == NonSemanticClspvReflectionKernel) {
      return SPV_SUCCESS;
    }
  }
  ValidationState_t::diag(&DStack_1f8,_,SPV_ERROR_INVALID_ID,inst);
  pcVar6 = "Kernel must be a Kernel extended instruction";
  lVar5 = 0x2c;
LAB_002ddbaf:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&DStack_1f8,pcVar6,lVar5);
  DiagnosticStream::~DiagnosticStream(&DStack_1f8);
  return DStack_1f8.error_;
}

Assistant:

spv_result_t ValidateKernelDecl(ValidationState_t& _, const Instruction* inst) {
  const auto decl_id = inst->GetOperandAs<uint32_t>(4);
  const auto decl = _.FindDef(decl_id);
  if (!decl || !spvIsExtendedInstruction(decl->opcode())) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Kernel must be a Kernel extended instruction";
  }

  if (decl->GetOperandAs<uint32_t>(2) != inst->GetOperandAs<uint32_t>(2)) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Kernel must be from the same extended instruction import";
  }

  const auto ext_inst =
      decl->GetOperandAs<NonSemanticClspvReflectionInstructions>(3);
  if (ext_inst != NonSemanticClspvReflectionKernel) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Kernel must be a Kernel extended instruction";
  }

  return SPV_SUCCESS;
}